

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

FunctionInfo * __thiscall
Js::DynamicProfileInfo::GetCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,
          bool *isConstructorCall,bool *isPolymorphicCall)

{
  CallSiteInfo *pCVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  
  pTVar4 = ThreadContext::GetContextForCurrentThread();
  if (pTVar4 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x464,"(ThreadContext::GetContextForCurrentThread())",
                                "ThreadContext::GetContextForCurrentThread()");
    if (!bVar3) goto LAB_008875d8;
    *puVar5 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x465,"(functionBody)","functionBody");
    if (!bVar3) goto LAB_008875d8;
    *puVar5 = 0;
  }
  if (functionBody->profiledCallSiteCount <= callSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x467,"(callSiteId < callSiteCount)","callSiteId < callSiteCount");
    if (!bVar3) goto LAB_008875d8;
    *puVar5 = 0;
  }
  if (((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x44 & 0xc) == 0) {
    bVar3 = HasCallSiteInfo(functionBody);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x468,
                                  "(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody))"
                                  ,
                                  "functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody)"
                                 );
      if (!bVar3) {
LAB_008875d8:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  pCVar1 = (this->callSiteInfo).ptr;
  *isConstructorCall =
       (bool)((byte)((ushort)*(undefined2 *)&pCVar1[callSiteId].field_0x2 >> 0xd) & 1);
  if ((*(ushort *)&pCVar1[callSiteId].field_0x2 >> 0xe & 1) == 0) {
    if (-1 < (short)*(ushort *)&pCVar1[callSiteId].field_0x2) {
      pFVar6 = GetFunctionInfo(functionBody,pCVar1[callSiteId].u.functionData.sourceId,
                               pCVar1[callSiteId].u.functionData.functionId);
      return pFVar6;
    }
    *isPolymorphicCall = true;
  }
  return (FunctionInfo *)0x0;
}

Assistant:

FunctionInfo * DynamicProfileInfo::GetCallSiteInfo(FunctionBody* functionBody, ProfileId callSiteId, bool *isConstructorCall, bool *isPolymorphicCall)
    {
        Assert(ThreadContext::GetContextForCurrentThread());
        Assert(functionBody);
        const auto callSiteCount = functionBody->GetProfiledCallSiteCount();
        Assert(callSiteId < callSiteCount);
        Assert(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody));

        *isConstructorCall = callSiteInfo[callSiteId].isConstructorCall;
        if (callSiteInfo[callSiteId].dontInline)
        {
            return nullptr;
        }

        if (!callSiteInfo[callSiteId].isPolymorphic)
        {
            Js::SourceId sourceId = callSiteInfo[callSiteId].u.functionData.sourceId;
            Js::LocalFunctionId functionId = callSiteInfo[callSiteId].u.functionData.functionId;
            return GetFunctionInfo(functionBody, sourceId, functionId);
        }
        else
        {
            *isPolymorphicCall = true;
        }
        return nullptr;
    }